

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_NPUSHW(TT_ExecContext exc,FT_Long *args)

{
  ushort uVar1;
  FT_Short FVar2;
  ushort local_1c;
  FT_UShort K;
  FT_UShort L;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = (ushort)exc->code[exc->IP + 1];
  if ((uint)uVar1 < (uint)(((int)exc->stackSize + 1) - (int)exc->top)) {
    exc->IP = exc->IP + 2;
    for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
      FVar2 = GetShortIns(exc);
      args[local_1c] = (long)FVar2;
    }
    exc->step_ins = '\0';
    exc->new_top = (ulong)uVar1 + exc->new_top;
  }
  else {
    exc->error = 0x82;
  }
  return;
}

Assistant:

static void
  Ins_NPUSHW( TT_ExecContext  exc,
              FT_Long*        args )
  {
    FT_UShort  L, K;


    L = (FT_UShort)exc->code[exc->IP + 1];

    if ( BOUNDS( L, exc->stackSize + 1 - exc->top ) )
    {
      exc->error = FT_THROW( Stack_Overflow );
      return;
    }

    exc->IP += 2;

    for ( K = 0; K < L; K++ )
      args[K] = GetShortIns( exc );

    exc->step_ins = FALSE;
    exc->new_top += L;
  }